

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

bool inipp::extract<char,bool>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool *dst)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  long *plVar4;
  bool local_1a9;
  istringstream local_1a8 [7];
  bool result;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> is;
  char local_21;
  bool *pbStack_20;
  char c;
  bool *dst_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  
  pbStack_20 = dst;
  dst_local = (bool *)value;
  std::__cxx11::istringstream::istringstream(local_1a8,value,8);
  piVar3 = (istream *)std::istream::operator>>((istream *)local_1a8,std::boolalpha);
  plVar4 = (long *)std::istream::operator>>(piVar3,&local_1a9);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (bVar1) {
    piVar3 = std::operator>>((istream *)local_1a8,&local_21);
    bVar2 = std::ios::operator!((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if ((bVar2 & 1) != 0) {
      *pbStack_20 = (bool)(local_1a9 & 1);
      value_local._7_1_ = 1;
      goto LAB_0011c184;
    }
  }
  value_local._7_1_ = 0;
LAB_0011c184:
  std::__cxx11::istringstream::~istringstream(local_1a8);
  return (bool)(value_local._7_1_ & 1);
}

Assistant:

inline bool extract(const std::basic_string<CharT> & value, T & dst) {
	CharT c;
	std::basic_istringstream<CharT> is{ value };
	T result;
	if ((is >> std::boolalpha >> result) && !(is >> c)) {
		dst = result;
		return true;
	}
	else {
		return false;
	}
}